

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac.c
# Opt level: O3

HMAC_context * Curl_HMAC_init(HMAC_params *hashparams,uchar *key,uint keylen)

{
  ulong in_RAX;
  HMAC_context *pHVar1;
  ulong uVar2;
  HMAC_context *pHVar3;
  ulong uVar4;
  uchar b;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  pHVar1 = (HMAC_context *)
           (*Curl_cmalloc)((ulong)(hashparams->hmac_ctxtsize * 2) +
                           (ulong)hashparams->hmac_resultlen + 0x18);
  if (pHVar1 != (HMAC_context *)0x0) {
    pHVar1->hmac_hash = hashparams;
    pHVar3 = pHVar1 + 1;
    pHVar1->hmac_hashctxt1 = pHVar3;
    pHVar1->hmac_hashctxt2 = (void *)((long)&pHVar1[1].hmac_hash + (ulong)hashparams->hmac_ctxtsize)
    ;
    if (hashparams->hmac_maxkeylen < keylen) {
      (*hashparams->hmac_hinit)(pHVar3);
      (*hashparams->hmac_hupdate)(pHVar1->hmac_hashctxt1,key,keylen);
      key = (uchar *)((ulong)hashparams->hmac_ctxtsize + (long)pHVar1->hmac_hashctxt2);
      (*hashparams->hmac_hfinal)(key,pHVar1->hmac_hashctxt1);
      keylen = hashparams->hmac_resultlen;
      pHVar3 = (HMAC_context *)pHVar1->hmac_hashctxt1;
    }
    (*hashparams->hmac_hinit)(pHVar3);
    (*hashparams->hmac_hinit)(pHVar1->hmac_hashctxt2);
    uVar4 = (ulong)keylen;
    if (keylen != 0) {
      uVar2 = 0;
      do {
        uStack_38 = CONCAT17(key[uVar2],(undefined7)uStack_38) ^ 0x3600000000000000;
        (*hashparams->hmac_hupdate)(pHVar1->hmac_hashctxt1,(uchar *)((long)&uStack_38 + 7),1);
        uStack_38 = CONCAT17(key[uVar2],(undefined7)uStack_38) ^ 0x5c00000000000000;
        (*hashparams->hmac_hupdate)(pHVar1->hmac_hashctxt2,(uchar *)((long)&uStack_38 + 7),1);
        uVar2 = uVar2 + 1;
      } while (uVar4 != uVar2);
    }
    if (keylen < hashparams->hmac_maxkeylen) {
      do {
        (*hashparams->hmac_hupdate)(pHVar1->hmac_hashctxt1,"6\\",1);
        (*hashparams->hmac_hupdate)(pHVar1->hmac_hashctxt2,"\\",1);
        uVar4 = uVar4 + 1;
      } while (uVar4 < hashparams->hmac_maxkeylen);
    }
  }
  return pHVar1;
}

Assistant:

HMAC_context *
Curl_HMAC_init(const HMAC_params * hashparams,
               const unsigned char *key,
               unsigned int keylen)
{
  size_t i;
  HMAC_context *ctxt;
  unsigned char *hkey;
  unsigned char b;

  /* Create HMAC context. */
  i = sizeof(*ctxt) + 2 * hashparams->hmac_ctxtsize +
    hashparams->hmac_resultlen;
  ctxt = malloc(i);

  if(!ctxt)
    return ctxt;

  ctxt->hmac_hash = hashparams;
  ctxt->hmac_hashctxt1 = (void *) (ctxt + 1);
  ctxt->hmac_hashctxt2 = (void *) ((char *) ctxt->hmac_hashctxt1 +
      hashparams->hmac_ctxtsize);

  /* If the key is too long, replace it by its hash digest. */
  if(keylen > hashparams->hmac_maxkeylen) {
    (*hashparams->hmac_hinit)(ctxt->hmac_hashctxt1);
    (*hashparams->hmac_hupdate)(ctxt->hmac_hashctxt1, key, keylen);
    hkey = (unsigned char *) ctxt->hmac_hashctxt2 + hashparams->hmac_ctxtsize;
    (*hashparams->hmac_hfinal)(hkey, ctxt->hmac_hashctxt1);
    key = hkey;
    keylen = hashparams->hmac_resultlen;
  }

  /* Prime the two hash contexts with the modified key. */
  (*hashparams->hmac_hinit)(ctxt->hmac_hashctxt1);
  (*hashparams->hmac_hinit)(ctxt->hmac_hashctxt2);

  for(i = 0; i < keylen; i++) {
    b = (unsigned char)(*key ^ hmac_ipad);
    (*hashparams->hmac_hupdate)(ctxt->hmac_hashctxt1, &b, 1);
    b = (unsigned char)(*key++ ^ hmac_opad);
    (*hashparams->hmac_hupdate)(ctxt->hmac_hashctxt2, &b, 1);
  }

  for(; i < hashparams->hmac_maxkeylen; i++) {
    (*hashparams->hmac_hupdate)(ctxt->hmac_hashctxt1, &hmac_ipad, 1);
    (*hashparams->hmac_hupdate)(ctxt->hmac_hashctxt2, &hmac_opad, 1);
  }

  /* Done, return pointer to HMAC context. */
  return ctxt;
}